

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamMultiReader_p.cpp
# Opt level: O0

IMultiMerger * __thiscall
BamTools::Internal::BamMultiReaderPrivate::CreateAlignmentCache(BamMultiReaderPrivate *this)

{
  int iVar1;
  __type _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  SamHeader header;
  SamHeader *in_stack_fffffffffffffe50;
  Unsorted *in_stack_fffffffffffffe58;
  MultiMerger<BamTools::Algorithms::Sort::Unsorted> *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe78;
  Order in_stack_fffffffffffffe7c;
  Order OVar3;
  MultiMerger<BamTools::Algorithms::Sort::ByName> *in_stack_fffffffffffffe80;
  Order local_170;
  ByPosition local_16c;
  BamMultiReaderPrivate *in_stack_fffffffffffffe98;
  IMultiMerger *local_8;
  
  if (((byte)in_RDI[1]._M_dataplus & 1) == 0) {
    GetHeader(in_stack_fffffffffffffe98);
    _Var2 = std::operator==(in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68))
    ;
    if (_Var2) {
      *(undefined4 *)&in_RDI[1].field_0x4 = 1;
    }
    else {
      _Var2 = std::operator==(in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68
                                                ));
      if (_Var2) {
        *(undefined4 *)&in_RDI[1].field_0x4 = 2;
      }
      else {
        *(undefined4 *)&in_RDI[1].field_0x4 = 0;
      }
    }
    SamHeader::~SamHeader(in_stack_fffffffffffffe50);
  }
  iVar1 = *(int *)&in_RDI[1].field_0x4;
  if (iVar1 == 0) {
    local_8 = (IMultiMerger *)operator_new(0x58);
    MultiMerger<BamTools::Algorithms::Sort::Unsorted>::MultiMerger
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  }
  else if (iVar1 == 1) {
    local_8 = (IMultiMerger *)operator_new(0x38);
    local_170 = AscendingOrder;
    Algorithms::Sort::ByPosition::ByPosition(&local_16c,&local_170);
    MultiMerger<BamTools::Algorithms::Sort::ByPosition>::MultiMerger
              ((MultiMerger<BamTools::Algorithms::Sort::ByPosition> *)in_stack_fffffffffffffe80,
               (ByPosition *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  }
  else if (iVar1 == 2) {
    local_8 = (IMultiMerger *)operator_new(0x38);
    OVar3 = AscendingOrder;
    Algorithms::Sort::ByName::ByName
              ((ByName *)&stack0xfffffffffffffe80,(Order *)&stack0xfffffffffffffe7c);
    MultiMerger<BamTools::Algorithms::Sort::ByName>::MultiMerger
              (in_stack_fffffffffffffe80,(ByName *)CONCAT44(OVar3,in_stack_fffffffffffffe78));
  }
  else {
    local_8 = (IMultiMerger *)0x0;
  }
  return local_8;
}

Assistant:

IMultiMerger* BamMultiReaderPrivate::CreateAlignmentCache()
{

    // if no merge order set explicitly, use SAM header to lookup proper order
    if (!m_hasUserMergeOrder) {

        // fetch SamHeader from BAM files
        SamHeader header = GetHeader();

        // if BAM files are sorted by position
        if (header.SortOrder == Constants::SAM_HD_SORTORDER_COORDINATE)
            m_mergeOrder = BamMultiReader::MergeByCoordinate;

        // if BAM files are sorted by read name
        else if (header.SortOrder == Constants::SAM_HD_SORTORDER_QUERYNAME)
            m_mergeOrder = BamMultiReader::MergeByName;

        // otherwise, sorting is either "unknown" or marked as "unsorted"
        else
            m_mergeOrder = BamMultiReader::RoundRobinMerge;
    }

    // use current merge order to create proper 'multi-merger'
    switch (m_mergeOrder) {

        // merge BAM files by position
        case BamMultiReader::MergeByCoordinate:
            return new MultiMerger<Algorithms::Sort::ByPosition>();

        // merge BAM files by read name
        case BamMultiReader::MergeByName:
            return new MultiMerger<Algorithms::Sort::ByName>();

        // sorting is "unknown", "unsorted" or "ignored"... so use unsorted merger
        case BamMultiReader::RoundRobinMerge:
            return new MultiMerger<Algorithms::Sort::Unsorted>();

        // unknown merge order, can't create merger
        default:
            return 0;
    }
}